

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChLoadXYZROTnode::ChLoadXYZROTnode
          (ChLoadXYZROTnode *this,shared_ptr<chrono::fea::ChNodeFEAxyzrot> *body)

{
  double dVar1;
  __shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,void>
            (local_20,&body->
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)
  ;
  ChLoadCustom::ChLoadCustom(&this->super_ChLoadCustom,(shared_ptr<chrono::ChLoadable> *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  (this->super_ChLoadCustom).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadCustom_01176cf0;
  (this->computed_abs_force).m_data[0] = 0.0;
  (this->computed_abs_force).m_data[1] = 0.0;
  (this->computed_abs_force).m_data[2] = 0.0;
  (this->computed_abs_torque).m_data[0] = 0.0;
  (this->computed_abs_force).m_data[2] = 0.0;
  (this->computed_abs_torque).m_data[0] = 0.0;
  (this->computed_abs_torque).m_data[1] = 0.0;
  (this->computed_abs_torque).m_data[2] = 0.0;
  dVar1 = DAT_011dd3e0;
  if (this != (ChLoadXYZROTnode *)(Q_FLIP_AROUND_X + 8)) {
    (this->computed_abs_force).m_data[0] = VNULL;
    (this->computed_abs_force).m_data[1] = dVar1;
    (this->computed_abs_force).m_data[2] = DAT_011dd3e8;
  }
  dVar1 = DAT_011dd3e0;
  if (this != (ChLoadXYZROTnode *)(Q_ROTATE_Z_TO_X + 0x10)) {
    (this->computed_abs_torque).m_data[0] = VNULL;
    (this->computed_abs_torque).m_data[1] = dVar1;
    (this->computed_abs_torque).m_data[2] = DAT_011dd3e8;
  }
  return;
}

Assistant:

ChLoadXYZROTnode::ChLoadXYZROTnode(std::shared_ptr<ChNodeFEAxyzrot> body) : ChLoadCustom(body) {
    computed_abs_force = VNULL;
    computed_abs_torque = VNULL;
}